

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

void forth_damage(Forth *ptr)

{
  int iVar1;
  long lVar2;
  runtime_error *this;
  
  iVar1 = ForthToInt(ptr);
  if ((ulong)(ptr->dStack).top + 1 <
      (ulong)((long)(ptr->dStack).stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(ptr->dStack).stack.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    lVar2 = c_damage((long)iVar1);
    cppforth::Forth::ForthStack<unsigned_int>::push(&ptr->dStack,(uint)lVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_loc_y does not have space in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_damage(cppforth::Forth* ptr){
	int num = ForthToInt(ptr);
	if (ptr->forth_available(1)){
		ptr->forth_push(c_damage(num));
	}
	else {
		throw std::runtime_error(("forth_loc_y does not have space in Forth stack"));
	}
}